

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall
helics::CallbackFederate::CallbackFederate
          (CallbackFederate *this,string_view fedName,string *configString)

{
  string_view fedName_00;
  string_view fedName_01;
  CombinationFederate *in_RDI;
  FederateInfo *in_stack_fffffffffffffdc0;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *this_00;
  string *in_stack_fffffffffffffdd0;
  void **in_stack_fffffffffffffdd8;
  undefined1 *puVar1;
  char *pcVar2;
  char local_1e0 [40];
  string *in_stack_fffffffffffffe48;
  FederateInfo *in_stack_fffffffffffffe58;
  Federate *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  CallbackFederate *in_stack_fffffffffffffe70;
  
  puVar1 = &(in_RDI->super_ValueFederate).field_0x98;
  pcVar2 = local_1e0;
  loadFederateInfo(in_stack_fffffffffffffe48);
  fedName_01._M_str = (char *)in_stack_fffffffffffffe70;
  fedName_01._M_len = in_stack_fffffffffffffe68;
  Federate::Federate(in_stack_fffffffffffffe60,fedName_01,in_stack_fffffffffffffe58);
  FederateInfo::~FederateInfo(in_stack_fffffffffffffdc0);
  fedName_00._M_str = pcVar2;
  fedName_00._M_len = (size_t)puVar1;
  helics::CombinationFederate::CombinationFederate
            (in_RDI,in_stack_fffffffffffffdd8,fedName_00,in_stack_fffffffffffffdd0);
  (in_RDI->super_ValueFederate)._vptr_ValueFederate = (_func_int **)0xa46698;
  *(undefined8 *)&(in_RDI->super_ValueFederate).field_0x98 = 0xa467c0;
  *(undefined8 *)&(in_RDI->super_ValueFederate).field_0x10 = 0xa466f8;
  this_00 = (function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
             *)&(in_RDI->super_ValueFederate).field_0x20;
  std::shared_ptr<helics::CallbackFederateOperator>::shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)0x3bdf84);
  (in_RDI->super_ValueFederate).field_0x30 = 0;
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)this_00);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function(this_00);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)this_00);
  loadOperator(in_stack_fffffffffffffe70);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(std::string_view fedName, const std::string& configString):
    Federate(fedName, loadFederateInfo(configString)), CombinationFederate(fedName, configString)
{
    loadOperator();
}